

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O0

void __thiscall
glslang::TParseContext::blockMemberExtensionCheck
          (TParseContext *this,TSourceLoc *loc,TIntermTyped *base,int member,TString *memberName)

{
  TSymbolTable *this_00;
  int iVar1;
  uint uVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  long *plVar3;
  undefined4 extraout_var_02;
  TSymbol *pTVar4;
  undefined4 extraout_var_03;
  ulong uVar5;
  undefined8 uVar6;
  char *pcVar7;
  TVariable *variable;
  TSymbol *symbol;
  TIntermSymbol *baseSymbol;
  TString *memberName_local;
  int member_local;
  TIntermTyped *base_local;
  TSourceLoc *loc_local;
  TParseContext *this_local;
  
  iVar1 = (*(base->super_TIntermNode)._vptr_TIntermNode[0x14])();
  if (CONCAT44(extraout_var,iVar1) == 0) {
    iVar1 = (*(base->super_TIntermNode)._vptr_TIntermNode[0x18])();
    symbol = (TSymbol *)CONCAT44(extraout_var_00,iVar1);
  }
  else {
    iVar1 = (*(base->super_TIntermNode)._vptr_TIntermNode[0x14])();
    plVar3 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_01,iVar1) + 400))();
    symbol = (TSymbol *)(**(code **)(*plVar3 + 0x60))();
  }
  if (symbol != (TSymbol *)0x0) {
    this_00 = (this->super_TParseContextBase).symbolTable;
    iVar1 = (*symbol->_vptr_TSymbol[0x32])();
    pTVar4 = TSymbolTable::find(this_00,(TString *)CONCAT44(extraout_var_02,iVar1),(bool *)0x0,
                                (bool *)0x0,(int *)0x0);
    if (pTVar4 != (TSymbol *)0x0) {
      iVar1 = (*pTVar4->_vptr_TSymbol[10])();
      plVar3 = (long *)CONCAT44(extraout_var_03,iVar1);
      if (((plVar3 != (long *)0x0) && (uVar5 = (**(code **)(*plVar3 + 0xf8))(), (uVar5 & 1) != 0))
         && (iVar1 = (**(code **)(*plVar3 + 0x100))(plVar3,member), 0 < iVar1)) {
        uVar2 = (**(code **)(*plVar3 + 0x100))(plVar3,member);
        uVar6 = (**(code **)(*plVar3 + 0x108))(plVar3,member);
        pcVar7 = std::__cxx11::
                 basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::c_str
                           (memberName);
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[5])
                  (this,loc,(ulong)uVar2,uVar6,pcVar7);
      }
    }
  }
  return;
}

Assistant:

void TParseContext::blockMemberExtensionCheck(const TSourceLoc& loc, const TIntermTyped* base, int member, const TString& memberName)
{
    // a block that needs extension checking is either 'base', or if arrayed,
    // one level removed to the left
    const TIntermSymbol* baseSymbol = nullptr;
    if (base->getAsBinaryNode() == nullptr)
        baseSymbol = base->getAsSymbolNode();
    else
        baseSymbol = base->getAsBinaryNode()->getLeft()->getAsSymbolNode();
    if (baseSymbol == nullptr)
        return;
    const TSymbol* symbol = symbolTable.find(baseSymbol->getName());
    if (symbol == nullptr)
        return;
    const TVariable* variable = symbol->getAsVariable();
    if (variable == nullptr)
        return;
    if (!variable->hasMemberExtensions())
        return;

    // We now have a variable that is the base of a dot reference
    // with members that need extension checking.
    if (variable->getNumMemberExtensions(member) > 0)
        requireExtensions(loc, variable->getNumMemberExtensions(member), variable->getMemberExtensions(member), memberName.c_str());
}